

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::lognormal_dist<double>::pdf(lognormal_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  result_type_conflict2 rVar2;
  double dVar3;
  
  rVar2 = 0.0;
  if (0.0 < x) {
    dVar3 = log(x);
    dVar1 = (this->P).sigma_;
    dVar3 = (dVar3 - (this->P).mu_) / dVar1;
    dVar3 = exp(dVar3 * dVar3 * -0.5);
    rVar2 = dVar3 * (0.3989422804014327 / (dVar1 * x));
  }
  return rVar2;
}

Assistant:

pdf(result_type x) const {
      if (x <= 0)
        return 0;
      result_type t((math::ln(x) - P.mu()) / P.sigma());
      return math::constants<result_type>::one_over_sqrt_2pi / (x * P.sigma()) *
             math::exp(-t * t / 2);
    }